

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O1

HelicsFederate generateNewHelicsFederateObject(shared_ptr<helics::Federate> *fed,FederateType type)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Head_base<0UL,_helics::FedObject_*,_false> _Var3;
  FedObject *__s;
  __single_object fedI;
  _Head_base<0UL,_helics::FedObject_*,_false> local_48;
  _Head_base<0UL,_helics::FedObject_*,_false> local_40;
  MasterObjectHolder *local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  __s = (FedObject *)operator_new(0x108);
  memset(__s,0,0x108);
  __s->type = INVALID;
  __s->index = -2;
  __s->valid = 0;
  memset(&__s->fedptr,0,0xb8);
  (__s->commandBuffer).first._M_dataplus._M_p = (pointer)&(__s->commandBuffer).first.field_2;
  (__s->commandBuffer).first._M_string_length = 0;
  (__s->commandBuffer).first.field_2._M_local_buf[0] = '\0';
  (__s->commandBuffer).second._M_dataplus._M_p = (pointer)&(__s->commandBuffer).second.field_2;
  (__s->commandBuffer).second._M_string_length = 0;
  (__s->commandBuffer).second.field_2._M_local_buf[0] = '\0';
  peVar1 = (fed->super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var2 = (fed->super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  (fed->super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  (fed->super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this = (__s->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi;
  (__s->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (__s->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       p_Var2;
  local_48._M_head_impl = __s;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  _Var3._M_head_impl = local_48._M_head_impl;
  (local_48._M_head_impl)->type = type;
  (local_48._M_head_impl)->valid = 0x2352188;
  getMasterHolder();
  local_40._M_head_impl = local_48._M_head_impl;
  local_48._M_head_impl = (FedObject *)0x0;
  MasterObjectHolder::addFed
            (local_38,(unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)
                      &local_40);
  std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::~unique_ptr
            ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)&local_40);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  std::unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_>::~unique_ptr
            ((unique_ptr<helics::FedObject,_std::default_delete<helics::FedObject>_> *)&local_48);
  return _Var3._M_head_impl;
}

Assistant:

HelicsFederate generateNewHelicsFederateObject(std::shared_ptr<helics::Federate> fed, helics::FederateType type)
{
    auto fedI = std::make_unique<helics::FedObject>();
    fedI->fedptr = std::move(fed);
    fedI->type = type;
    fedI->valid = fedValidationIdentifier;
    auto* hfed = reinterpret_cast<HelicsFederate>(fedI.get());
    getMasterHolder()->addFed(std::move(fedI));
    return (hfed);
}